

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O0

void __thiscall CFGReader::CFGReader(CFGReader *this,string *filename)

{
  string *filename_local;
  CFGReader *this_local;
  
  this->_vptr_CFGReader = (_func_int **)&PTR__CFGReader_00171938;
  std::fstream::fstream(&this->m_input,(string *)filename,_S_in);
  std::
  map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
  ::map(&this->m_cfgs);
  return;
}

Assistant:

CFGReader::CFGReader(const std::string& filename)
	: m_input(filename, std::fstream::in) {
}